

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::concat<kj::CappedArray<char,14ul>>
          (StringTree *__return_storage_ptr__,StringTree *this,CappedArray<char,_14UL> *params)

{
  size_t size;
  size_t __n;
  Branch *pBVar1;
  String local_38;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  size = this->size_;
  __return_storage_ptr__->size_ = size;
  heapString(&local_38,size);
  (__return_storage_ptr__->text).content.ptr = local_38.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_38.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_38.content.disposer;
  pBVar1 = (Branch *)
           _::HeapArrayDisposer::allocateImpl
                     (0x40,0,0,_::HeapArrayDisposer::Allocate_<kj::StringTree::Branch>::construct,
                      ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  __n = this->size_;
  (__return_storage_ptr__->branches).ptr = pBVar1;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  if (__n != 0) {
    if (local_38.content.size_ == 0) {
      local_38.content.ptr = (char *)0x0;
    }
    memcpy(local_38.content.ptr,&this->text,__n);
  }
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}